

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O1

bool __thiscall
MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::setValue
          (VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *this,int inVal)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _Node *p_Var4;
  
  if (this->needPush == true) {
    p_Var2 = (this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    *(undefined4 *)&p_Var3[1]._M_next = *(undefined4 *)&p_Var2[1]._M_next;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var4 = std::__cxx11::
             list<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::allocator<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>
             ::
             _M_create_node<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                       ((list<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::allocator<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>
                         *)&(this->super_VRDatum).attrList,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((this->super_VRDatum).attrList.
                            super__List_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    psVar1 = &(this->super_VRDatum).attrList.
              super__List_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->needPush = false;
    this->pushed = true;
  }
  *(int *)&(this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next[1]._M_next = inVal;
  return true;
}

Assistant:

bool setValue(const T inVal) {
    // This is a little optimization.  You only need to push things
    // onto the stack if the value actually changes.
    if (needPush) {
      value.push_front( value.front() );
      attrList.push_front( attrList.front() );
      needPush = false;
      pushed = true;
    }
    value.front() = inVal;
    return true;
  }